

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

var * __thiscall cs::domain_manager::get_var(domain_manager *this,var_id *id)

{
  ulong uVar1;
  domain_type *pdVar2;
  size_t sVar3;
  stack_pointer psVar4;
  runtime_error *this_00;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  domain_type *pdVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar4 = *this->fiber_stack;
  if (psVar4 != (stack_pointer)0x0) {
    uVar1 = id->m_domain_id;
    pdVar8 = psVar4->m_current;
    uVar7 = ((long)pdVar8 - (long)psVar4->m_start >> 5) * -0x5555555555555555;
    if ((uVar1 < uVar7) &&
       ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        pdVar8[-1 - uVar1].m_ref.super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)) goto LAB_0013b391;
    bVar11 = pdVar8 != psVar4->m_start;
    if (bVar11) {
      lVar10 = -0x60;
      sVar9 = 0;
      do {
        sVar3 = phmap::priv::
                raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                ::count<std::__cxx11::string>
                          ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                            *)((long)&((*this->fiber_stack)->m_current->m_reflect).
                                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .
                                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .ctrl_ + lVar10),&id->m_id);
        if (sVar3 != 0) {
          psVar4 = (stack_pointer)
                   domain_type::get_var_no_check
                             ((domain_type *)
                              ((long)&((*this->fiber_stack)->m_current->m_reflect).
                                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .
                                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .ctrl_ + lVar10),id,sVar9);
          goto LAB_0013b2d9;
        }
        sVar9 = sVar9 + 1;
        bVar11 = sVar9 < uVar7;
        lVar10 = lVar10 + -0x60;
      } while (uVar7 + (uVar7 == 0) != sVar9);
      psVar4 = (stack_pointer)0x0;
    }
LAB_0013b2d9:
    if (bVar11) {
      return (var *)psVar4;
    }
  }
  uVar1 = id->m_domain_id;
  pdVar2 = (this->m_data).m_start;
  pdVar8 = (this->m_data).m_current;
  uVar7 = ((long)pdVar8 - (long)pdVar2 >> 5) * -0x5555555555555555;
  if ((uVar7 <= uVar1) ||
     ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      pdVar8[-1 - uVar1].m_ref.super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )) {
    bVar11 = pdVar8 != pdVar2;
    if (bVar11) {
      lVar10 = -0x60;
      sVar9 = 0;
      do {
        sVar3 = phmap::priv::
                raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                ::count<std::__cxx11::string>
                          ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                            *)((long)&(((this->m_data).m_current)->m_reflect).
                                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .
                                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .ctrl_ + lVar10),&id->m_id);
        if (sVar3 != 0) {
          psVar4 = (stack_pointer)
                   domain_type::get_var_no_check
                             ((domain_type *)
                              ((long)&(((this->m_data).m_current)->m_reflect).
                                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .
                                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .ctrl_ + lVar10),id,sVar9);
          break;
        }
        sVar9 = sVar9 + 1;
        bVar11 = sVar9 < uVar7;
        lVar10 = lVar10 + -0x60;
      } while (uVar7 + (uVar7 == 0) != sVar9);
    }
    if (bVar11) {
      return (var *)psVar4;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_50,"Use of undefined variable \"",&id->m_id);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    runtime_error::runtime_error(this_00,&local_70);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_0013b391:
  return (var *)(stack_pointer)
                (pdVar8[-1 - uVar1].m_slot.
                 super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                 super__Vector_impl_data._M_start + id->m_slot_id);
}

Assistant:

inline var &get_var(const var_id &id)
		{
			if (fiber_stack != nullptr) {
				if (id.m_domain_id < fiber_stack->size() && (*fiber_stack)[id.m_domain_id].consistence(id))
					return (*fiber_stack)[id.m_domain_id].get_var_by_id(id.m_slot_id);
				for (std::size_t i = 0, size = fiber_stack->size(); i < size; ++i)
					if ((*fiber_stack)[i].exist(id))
						return (*fiber_stack)[i].get_var_no_check(id, i);
			}
			if (id.m_domain_id < m_data.size() && m_data[id.m_domain_id].consistence(id))
				return m_data[id.m_domain_id].get_var_by_id(id.m_slot_id);
			for (std::size_t i = 0, size = m_data.size(); i < size; ++i)
				if (m_data[i].exist(id))
					return m_data[i].get_var_no_check(id, i);
			throw runtime_error("Use of undefined variable \"" + id.get_id() + "\".");
		}